

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O0

bool __thiscall
chaiscript::parser::ChaiScript_Parser::Quoted_String(ChaiScript_Parser *this,bool t_capture)

{
  bool bVar1;
  value_type *__x;
  byte in_SIL;
  long in_RDI;
  bool is_interpolated;
  size_type prev_stack_top;
  string match;
  Position start;
  anon_class_32_4_0aede7d2 *in_stack_00000ef0;
  value_type *in_stack_fffffffffffffea8;
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  *in_stack_fffffffffffffeb0;
  ChaiScript_Parser *in_stack_fffffffffffffee0;
  int in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  string *in_stack_ffffffffffffff10;
  ChaiScript_Parser *in_stack_ffffffffffffff18;
  string local_c8 [64];
  string *local_88;
  undefined8 *local_80;
  size_type *local_70;
  undefined1 local_61;
  size_type local_60;
  string local_58 [8];
  string *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  ChaiScript_Parser *in_stack_ffffffffffffffc0;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  byte local_11;
  byte local_1;
  
  local_11 = in_SIL & 1;
  SkipWS(in_stack_fffffffffffffee0,SUB81((ulong)in_RDI >> 0x38,0));
  if ((local_11 & 1) == 0) {
    local_1 = Quoted_String_(in_stack_ffffffffffffff18);
  }
  else {
    local_38 = *(undefined8 *)(in_RDI + 0xcb8);
    local_30 = *(undefined8 *)(in_RDI + 0xcc0);
    local_28 = *(undefined8 *)(in_RDI + 0xcc8);
    local_20 = *(undefined8 *)(in_RDI + 0xcd0);
    bVar1 = Quoted_String_(in_stack_ffffffffffffff18);
    if (bVar1) {
      std::__cxx11::string::string(local_58);
      local_60 = std::
                 vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                 ::size((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                         *)(in_RDI + 0x70));
      local_80 = &local_38;
      local_70 = &local_60;
      local_88 = local_58;
      local_61 = Quoted_String::anon_class_32_4_0aede7d2::operator()(in_stack_00000ef0);
      if ((bool)local_61) {
        std::__cxx11::string::string(local_c8,local_58);
        make_node<chaiscript::eval::Quoted_String_AST_Node>
                  (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
                   in_stack_ffffffffffffff08);
        std::
        vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
        ::push_back(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
        std::shared_ptr<chaiscript::AST_Node>::~shared_ptr
                  ((shared_ptr<chaiscript::AST_Node> *)0x236844);
        std::__cxx11::string::~string(local_c8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&stack0xffffffffffffff18,"+",(allocator *)&stack0xffffffffffffff17);
        build_match<chaiscript::eval::Binary_Operator_AST_Node>
                  (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff18);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff17);
      }
      else {
        __x = (value_type *)(in_RDI + 0x70);
        std::__cxx11::string::string((string *)&stack0xfffffffffffffee0,local_58);
        make_node<chaiscript::eval::Quoted_String_AST_Node>
                  (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
                   in_stack_ffffffffffffff08);
        std::
        vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
        ::push_back(in_stack_fffffffffffffeb0,__x);
        std::shared_ptr<chaiscript::AST_Node>::~shared_ptr
                  ((shared_ptr<chaiscript::AST_Node> *)0x2369b9);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffee0);
      }
      local_1 = 1;
      std::__cxx11::string::~string(local_58);
    }
    else {
      local_1 = 0;
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool Quoted_String(const bool t_capture = false) {
        SkipWS();

        if (!t_capture) {
          return Quoted_String_();
        } else {
          const auto start = m_position;

          if (Quoted_String_()) {
            std::string match;
            const auto prev_stack_top = m_match_stack.size();

            bool is_interpolated = [&]()->bool {
              Char_Parser<std::string> cparser(match, true);


              auto s = start + 1, end = m_position - 1;

              while (s != end) {
                if (cparser.saw_interpolation_marker) {
                  if (*s == '{') {
                    //We've found an interpolation point

                    if (cparser.is_interpolated) {
                      //If we've seen previous interpolation, add on instead of making a new one
                      m_match_stack.push_back(make_node<eval::Quoted_String_AST_Node>(match, start.line, start.col));

                      build_match<eval::Binary_Operator_AST_Node>(prev_stack_top, "+");
                    } else {
                      m_match_stack.push_back(make_node<eval::Quoted_String_AST_Node>(match, start.line, start.col));
                    }

                    //We've finished with the part of the string up to this point, so clear it
                    match.clear();

                    std::string eval_match;

                    ++s;
                    while ((s != end) && (*s != '}')) {
                      eval_match.push_back(*s);
                      ++s;
                    }

                    if (*s == '}') {
                      cparser.is_interpolated = true;
                      ++s;

                      const auto tostr_stack_top = m_match_stack.size();

                      m_match_stack.push_back(make_node<eval::Id_AST_Node>("to_string", start.line, start.col));

                      const auto ev_stack_top = m_match_stack.size();

                      try {
                        ChaiScript_Parser parser;
                        parser.parse(eval_match, "instr eval");
                        m_match_stack.push_back(parser.ast());
                      } catch (const exception::eval_error &e) {
                        throw exception::eval_error(e.what(), File_Position(start.line, start.col), *m_filename);
                      }

                      build_match<eval::Arg_List_AST_Node>(ev_stack_top);
                      build_match<eval::Fun_Call_AST_Node>(tostr_stack_top);
                      build_match<eval::Binary_Operator_AST_Node>(prev_stack_top, "+");
                    } else {
                      throw exception::eval_error("Unclosed in-string eval", File_Position(start.line, start.col), *m_filename);
                    }
                  } else {
                    match.push_back('$');
                  }
                  cparser.saw_interpolation_marker = false;
                } else {
                  cparser.parse(*s, start.line, start.col, *m_filename);
                  ++s;
                }
              }

              return cparser.is_interpolated;
            }();

            if (is_interpolated) {
              m_match_stack.push_back(make_node<eval::Quoted_String_AST_Node>(match, start.line, start.col));

              build_match<eval::Binary_Operator_AST_Node>(prev_stack_top, "+");
            } else {
              m_match_stack.push_back(make_node<eval::Quoted_String_AST_Node>(match, start.line, start.col));
            }
            return true;
          } else {
            return false;
          }
        }
      }